

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_scale_cols(Integer g_a,Integer g_v)

{
  double *pdVar1;
  float fVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  long lVar8;
  int iVar9;
  Integer IVar10;
  void *buf;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  bool bVar16;
  Integer hi [2];
  Integer lo [2];
  char *ptr;
  Integer ld;
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer vlo;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b0;
  undefined1 (*local_3a8) [16];
  long local_3a0;
  int local_394;
  Integer local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  Integer local_348;
  long local_340;
  _iterator_hdl local_330;
  
  local_390 = g_v;
  pnga_nodeid();
  bVar16 = _ga_sync_begin != 0;
  local_394 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar16) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_scale_cols_");
  IVar10 = local_390;
  pnga_check_handle(local_390,"ga_scale_cols_");
  pnga_inquire(g_a,&local_380,&local_350,&local_348);
  local_3b0 = local_380;
  pnga_inquire(IVar10,&local_378,&local_368,&local_370);
  if (local_350 != 2) {
    pnga_error("ga_scale_cols_: wrong dimension for g_a.",local_350);
  }
  if (local_368 != 1) {
    pnga_error("ga_scale_cols_: wrong dimension for g_v.",local_368);
  }
  if (local_370 != local_340) {
    pnga_error("ga_scale_cols_: The size of the scalar array is not the same as the number of the rows of g_a."
               ,local_370);
  }
  if (local_378 != local_380) {
    pnga_error("ga_scale_cols_: input global arrays do not have the same data type. Global array type ="
               ,local_380);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar9 = pnga_local_iterator_next(&local_330,&local_3c8,&local_3d8,(char **)&local_3a8,&local_3a0);
  if (iVar9 != 0) {
    local_388 = local_3b0 + -0x3e9;
    do {
      lVar8 = local_3a0;
      pauVar14 = local_3a8;
      if ((0 < local_3c0) && (local_3c8 <= local_3d8)) {
        local_360 = local_3d0;
        lVar15 = local_3d0 - local_3c0;
        local_358 = local_3c0;
        IVar10 = GAsizeof(local_3b0);
        buf = malloc((lVar15 + 1) * IVar10);
        if (buf == (void *)0x0) {
          pnga_error("ga_scale_cols_:failed to allocate memory for the local buffer.",0);
        }
        pnga_get(local_390,&local_358,&local_360,buf,&local_360);
        switch(local_388) {
        case 0:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                iVar9 = *(int *)((long)buf + lVar15 * 4);
                lVar13 = 0;
                do {
                  *(int *)(*pauVar14 + lVar13 * 4) = *(int *)(*pauVar14 + lVar13 * 4) * iVar9;
                  lVar13 = lVar13 + 1;
                } while ((local_3d8 - local_3c8) + 1 != lVar13);
              }
              lVar15 = lVar15 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar8 * 4);
            } while (lVar15 != (local_3d0 - local_3c0) + 1);
          }
          break;
        case 1:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                lVar13 = *(long *)((long)buf + lVar15 * 8);
                lVar11 = -1;
                do {
                  *(long *)(*pauVar14 + lVar11 * 8 + 8) =
                       *(long *)(*pauVar14 + lVar11 * 8 + 8) * lVar13;
                  lVar11 = lVar11 + 1;
                } while (lVar11 < local_3d8 - local_3c8);
              }
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar8 * 8);
              bVar16 = lVar15 < local_3d0 - local_3c0;
              lVar15 = lVar15 + 1;
            } while (bVar16);
          }
          break;
        case 2:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                fVar2 = *(float *)((long)buf + lVar15 * 4);
                lVar13 = 0;
                do {
                  *(float *)(*pauVar14 + lVar13 * 4) = *(float *)(*pauVar14 + lVar13 * 4) * fVar2;
                  lVar13 = lVar13 + 1;
                } while ((local_3d8 - local_3c8) + 1 != lVar13);
              }
              lVar15 = lVar15 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar8 * 4);
            } while (lVar15 != (local_3d0 - local_3c0) + 1);
          }
          break;
        case 3:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                dVar3 = *(double *)((long)buf + lVar15 * 8);
                lVar13 = 0;
                do {
                  *(double *)(*pauVar14 + lVar13 * 8) = *(double *)(*pauVar14 + lVar13 * 8) * dVar3;
                  lVar13 = lVar13 + 1;
                } while ((local_3d8 - local_3c8) + 1 != lVar13);
              }
              lVar15 = lVar15 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar8 * 8);
            } while (lVar15 != (local_3d0 - local_3c0) + 1);
          }
          break;
        default:
          pnga_error("ga_scale_cols_: wrong data type:",local_3b0);
          break;
        case 5:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                uVar4 = *(undefined8 *)((long)buf + lVar15 * 8);
                lVar13 = 0;
                do {
                  *(ulong *)(*pauVar14 + lVar13 * 8) =
                       CONCAT44((float)((ulong)*(undefined8 *)(*pauVar14 + lVar13 * 8) >> 0x20) *
                                (float)((ulong)uVar4 >> 0x20),
                                (float)*(undefined8 *)(*pauVar14 + lVar13 * 8) * (float)uVar4);
                  lVar13 = lVar13 + 1;
                } while ((local_3d8 - local_3c8) + 1 != lVar13);
              }
              lVar15 = lVar15 + 1;
              pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar8 * 8);
            } while (lVar15 != (local_3d0 - local_3c0) + 1);
          }
          break;
        case 6:
          if (local_3c0 <= local_3d0) {
            lVar15 = 0;
            do {
              if (local_3c8 <= local_3d8) {
                pdVar1 = (double *)((long)buf + lVar15 * 0x10);
                dVar3 = *pdVar1;
                dVar7 = pdVar1[1];
                pauVar12 = pauVar14;
                lVar13 = (local_3d8 - local_3c8) + 1;
                do {
                  dVar6 = *(double *)(*pauVar12 + 8) * dVar7;
                  auVar5._8_4_ = SUB84(dVar6,0);
                  auVar5._0_8_ = *(double *)*pauVar12 * dVar3;
                  auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  *pauVar12 = auVar5;
                  pauVar12 = pauVar12 + 1;
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
              }
              lVar15 = lVar15 + 1;
              pauVar14 = pauVar14 + lVar8;
            } while (lVar15 != (local_3d0 - local_3c0) + 1);
          }
        }
        free(buf);
      }
      iVar9 = pnga_local_iterator_next
                        (&local_330,&local_3c8,&local_3d8,(char **)&local_3a8,&local_3a0);
    } while (iVar9 != 0);
  }
  if (local_394 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_scale_cols(Integer g_a, Integer g_v)
{
  Integer vndim, vdims/*, dim1*/, dim2, vtype, atype, type;
  Integer ld, lo[2], hi[2];
  Integer me = pnga_nodeid (), i;
  char *ptr;
  Integer andim, adims[2];
  int local_sync_begin,local_sync_end;
  Integer num_blocks_a;
  Integer chk;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_scale_cols_");
  pnga_check_handle (g_v, "ga_scale_cols_");

  pnga_inquire(g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  dim2 = adims[1];
  type = atype;
  pnga_inquire(g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_scale_cols_: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_scale_cols_: wrong dimension for g_v.", vndim);

  /*in internal functions, dim1 = number of rows of the matrix g_a*/
  /*in internal functions, dim2 = number of columns of the matrix g_a*/
  if (vdims != dim2)
    pnga_error
      ("ga_scale_cols_: The size of the scalar array is not the same as the number of the rows of g_a.",
       vdims);

  if (vtype != atype)
    {
      pnga_error
        ("ga_scale_cols_: input global arrays do not have the same data type. Global array type =",
         atype);
    }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,lo,hi,&ptr,&ld)) {
    sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution (g_a, me, lo, hi);

    chk = 1;
    for (i=0; i<andim; i++) {
      if (lo[i]>hi[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr (g_a, lo, hi, &ptr, &ld);

      sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);

      /* release access to the data */
      pnga_release_update (g_a, lo, hi);
    }
  } else {
    Integer nproc = pnga_nnodes();
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      Integer idx;
      for (idx=me; idx<num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, lo, hi);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);

      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          lo[i] = index[i]*block_dims[i]+1;
          hi[i] = (index[i] + 1)*block_dims[i];
          if (hi[i] > adims[i]) hi[i] = adims[i];
          if (hi[i] < lo[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_scale_col_values(type, lo, hi, ld, ptr, g_v);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}